

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int32_t zng_gzflush(gzFile file,int flush)

{
  int iVar1;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have != 0x79b1) {
    return -2;
  }
  if (4 < (uint)flush) {
    return -2;
  }
  if (*(int *)((long)&file[4].pos + 4) != 0) {
    return -2;
  }
  if ((int)file[4].pos != 0) {
    *(undefined4 *)&file[4].pos = 0;
    iVar1 = gz_zero((gz_state *)file,(off64_t)file[4].next);
    if (iVar1 == -1) goto LAB_0014539a;
  }
  gz_comp((gz_state *)file,flush);
LAB_0014539a:
  return *(int32_t *)((long)&file[4].pos + 4);
}

Assistant:

int Z_EXPORT PREFIX(gzflush)(gzFile file, int flush) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* check flush parameter */
    if (flush < 0 || flush > Z_FINISH)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* compress remaining data with requested flush */
    (void)gz_comp(state, flush);
    return state->err;
}